

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

int32_t get_inter_cost(AV1_COMP *cpi,MACROBLOCKD *xd,uint8_t *src_mb_buffer,int src_stride,
                      TplBuffers *tpl_tmp_buffers,BLOCK_SIZE bsize,TX_SIZE tx_size,int mi_row,
                      int mi_col,int rf_idx,MV *rfidx_mv,int use_pred_sad)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  int16_t *diff;
  tran_low_t *coeff;
  int iVar4;
  BitDepthInfo bd_info;
  short sVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000089;
  uint uVar8;
  int iVar9;
  uint8_t *dst;
  int dst_stride;
  InterPredParams local_108;
  
  local_108.bit_depth = xd->bd;
  uVar8 = (uint)xd->cur_buf->flags >> 3;
  bd_info = (BitDepthInfo)(CONCAT44(uVar8,local_108.bit_depth) & 0x1ffffffff);
  uVar6 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  dst_stride = 4 << (""[uVar6] & 0x1f);
  pAVar2 = cpi->ppi;
  iVar9 = 4 << (""[uVar6] & 0x1f);
  pYVar3 = (pAVar2->tpl_data).src_ref_frame[rf_idx];
  diff = tpl_tmp_buffers->src_diff;
  coeff = tpl_tmp_buffers->coeff;
  if ((cpi->sf).tpl_sf.subpel_force_stop != '\x03') {
    dst = (uint8_t *)((ulong)tpl_tmp_buffers->predictor8 >> 1);
    if ((uVar8 & 1) == 0) {
      dst = tpl_tmp_buffers->predictor8;
    }
    local_108.ref_frame_buf.buf0 = (pYVar3->field_5).field_0.y_buffer;
    local_108.ref_frame_buf.width = (pYVar3->field_0).field_0.y_width;
    local_108.ref_frame_buf.height = (pYVar3->field_1).field_0.y_height;
    local_108.ref_frame_buf.stride = (pYVar3->field_4).field_0.y_stride;
    local_108.pix_row = mi_row << 2;
    local_108.pix_col = mi_col << 2;
    local_108.use_hbd_buf = (uint)xd->cur_buf->flags >> 3 & 1;
    local_108.scale_factors = &(pAVar2->tpl_data).sf;
    local_108.subsampling_x = 0;
    local_108.subsampling_y = 0;
    local_108.is_intrabc = 0;
    local_108.mode = TRANSLATION_PRED;
    local_108.comp_mode = UNIFORM_SINGLE;
    local_108.top = -0x47000;
    local_108.left = -0x47000;
    local_108.interp_filter_params[1] = av1_interp_filter_params_list;
    local_108.interp_filter_params[0] = av1_interp_filter_params_list;
    if (dst_stride < 5) {
      local_108.interp_filter_params[0] = av1_interp_4tap;
    }
    if (iVar9 < 5) {
      local_108.interp_filter_params[1] = av1_interp_4tap;
    }
    local_108.ref_frame_buf.buf = (uint8_t *)0x0;
    local_108.conv_params.round_0 = 3;
    if (10 < local_108.bit_depth) {
      local_108.conv_params.round_0 = local_108.bit_depth + -7;
    }
    local_108.conv_params.round_1 = 0xb;
    if (10 < local_108.bit_depth) {
      local_108.conv_params.round_1 = 0x15 - local_108.bit_depth;
    }
    local_108.conv_params.do_average = 0;
    local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_108.conv_params.dst_stride = 0;
    local_108.conv_params.plane = 0;
    local_108.conv_params.is_compound = 0;
    local_108.conv_params.use_dist_wtd_comp_avg = 0;
    local_108.block_width = dst_stride;
    local_108.block_height = iVar9;
    av1_enc_build_one_inter_predictor(dst,dst_stride,rfidx_mv,&local_108);
    if (use_pred_sad == 0) {
      av1_subtract_block(bd_info,iVar9,dst_stride,diff,(long)dst_stride,src_mb_buffer,
                         (long)src_stride,dst,(long)dst_stride);
      av1_quick_txfm(0,tx_size,bd_info,diff,dst_stride,coeff);
      uVar8 = (*aom_satd)(coeff,iVar9 * dst_stride);
    }
    else {
      uVar8 = (*cpi->ppi->fn_ptr[uVar6].sdf)(src_mb_buffer,src_stride,dst,dst_stride);
    }
    return uVar8;
  }
  iVar1 = (pYVar3->field_4).field_0.y_stride;
  iVar7 = mi_row * iVar1 + mi_col;
  sVar5 = (short)(((int)rfidx_mv->row - (~(int)rfidx_mv->row >> 0x1f)) + 3U >> 3);
  iVar4 = ((int)rfidx_mv->col - (~(int)rfidx_mv->col >> 0x1f)) + 3 >> 3;
  if (use_pred_sad != 0) {
    uVar8 = (*pAVar2->fn_ptr[uVar6].sdf)
                      (src_mb_buffer,src_stride,
                       (pYVar3->field_5).buffers[0] +
                       (long)(iVar4 + sVar5 * iVar1) + (long)(iVar7 * 4),iVar1);
    return uVar8;
  }
  av1_subtract_block(bd_info,iVar9,dst_stride,diff,(long)dst_stride,src_mb_buffer,(long)src_stride,
                     (pYVar3->field_5).buffers[0] +
                     (long)(iVar4 + sVar5 * iVar1) + (long)(iVar7 * 4),(long)iVar1);
  av1_quick_txfm(0,tx_size,bd_info,diff,dst_stride,coeff);
  iVar9 = (*aom_satd)(coeff,iVar9 * dst_stride);
  return iVar9;
}

Assistant:

static inline int32_t get_inter_cost(const AV1_COMP *cpi, MACROBLOCKD *xd,
                                     const uint8_t *src_mb_buffer,
                                     int src_stride,
                                     TplBuffers *tpl_tmp_buffers,
                                     BLOCK_SIZE bsize, TX_SIZE tx_size,
                                     int mi_row, int mi_col, int rf_idx,
                                     MV *rfidx_mv, int use_pred_sad) {
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  const YV12_BUFFER_CONFIG *const ref_frame_ptr =
      tpl_data->src_ref_frame[rf_idx];
  int16_t *src_diff = tpl_tmp_buffers->src_diff;
  tran_low_t *coeff = tpl_tmp_buffers->coeff;
  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  int32_t inter_cost;

  if (cpi->sf.tpl_sf.subpel_force_stop != FULL_PEL) {
    const int_interpfilters kernel =
        av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    uint8_t *predictor8 = tpl_tmp_buffers->predictor8;
    uint8_t *predictor =
        is_cur_buf_hbd(xd) ? CONVERT_TO_BYTEPTR(predictor8) : predictor8;
    struct buf_2d ref_buf = { NULL, ref_frame_ptr->y_buffer,
                              ref_frame_ptr->y_width, ref_frame_ptr->y_height,
                              ref_frame_ptr->y_stride };
    InterPredParams inter_pred_params;
    av1_init_inter_params(&inter_pred_params, bw, bh, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &tpl_data->sf, &ref_buf, kernel);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    av1_enc_build_one_inter_predictor(predictor, bw, rfidx_mv,
                                      &inter_pred_params);

    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(src_mb_buffer, src_stride,
                                                    predictor, bw);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            predictor, bw, coeff, bw, bh, tx_size);
    }
  } else {
    int ref_mb_offset =
        mi_row * MI_SIZE * ref_frame_ptr->y_stride + mi_col * MI_SIZE;
    uint8_t *ref_mb = ref_frame_ptr->y_buffer + ref_mb_offset;
    int ref_stride = ref_frame_ptr->y_stride;
    const FULLPEL_MV fullmv = get_fullmv_from_mv(rfidx_mv);
    // Since sub-pel motion search is not performed, use the prediction pixels
    // directly from the reference block ref_mb
    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(
          src_mb_buffer, src_stride,
          &ref_mb[fullmv.row * ref_stride + fullmv.col], ref_stride);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            &ref_mb[fullmv.row * ref_stride + fullmv.col],
                            ref_stride, coeff, bw, bh, tx_size);
    }
  }
  return inter_cost;
}